

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateParser
          (ImmutableMessageGenerator *this,Printer *printer)

{
  Printer *pPVar1;
  bool bVar2;
  FileDescriptor *descriptor;
  char *__s;
  string *psVar3;
  allocator<char> local_39;
  string local_38;
  Printer *local_18;
  Printer *printer_local;
  ImmutableMessageGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  descriptor = Descriptor::file((this->super_MessageGenerator).descriptor_);
  bVar2 = ExposePublicParser(descriptor);
  __s = "private";
  if (bVar2) {
    __s = "@java.lang.Deprecated public";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_39);
  psVar3 = Descriptor::name_abi_cxx11_((this->super_MessageGenerator).descriptor_);
  io::Printer::Print(printer,
                     "$visibility$ static final com.google.protobuf.Parser<$classname$>\n    PARSER = new com.google.protobuf.AbstractParser<$classname$>() {\n"
                     ,"visibility",&local_38,"classname",psVar3);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  io::Printer::Indent(local_18);
  pPVar1 = local_18;
  psVar3 = Descriptor::name_abi_cxx11_((this->super_MessageGenerator).descriptor_);
  io::Printer::Print(pPVar1,
                     "public $classname$ parsePartialFrom(\n    com.google.protobuf.CodedInputStream input,\n    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n    throws com.google.protobuf.InvalidProtocolBufferException {\n"
                     ,"classname",psVar3);
  bVar2 = Context::HasGeneratedMethods(this->context_,(this->super_MessageGenerator).descriptor_);
  pPVar1 = local_18;
  if (bVar2) {
    psVar3 = Descriptor::name_abi_cxx11_((this->super_MessageGenerator).descriptor_);
    io::Printer::Print(pPVar1,"    return new $classname$(input, extensionRegistry);\n","classname",
                       psVar3);
  }
  else {
    io::Printer::Indent(local_18);
    io::Printer::Print(local_18,
                       "Builder builder = newBuilder();\ntry {\n  builder.mergeFrom(input, extensionRegistry);\n} catch (com.google.protobuf.InvalidProtocolBufferException e) {\n  throw e.setUnfinishedMessage(builder.buildPartial());\n} catch (java.io.IOException e) {\n  throw new com.google.protobuf.InvalidProtocolBufferException(\n      e.getMessage()).setUnfinishedMessage(\n          builder.buildPartial());\n}\nreturn builder.buildPartial();\n"
                      );
    io::Printer::Outdent(local_18);
  }
  io::Printer::Print(local_18,"}\n");
  io::Printer::Outdent(local_18);
  io::Printer::Print(local_18,"};\n\n");
  pPVar1 = local_18;
  psVar3 = Descriptor::name_abi_cxx11_((this->super_MessageGenerator).descriptor_);
  io::Printer::Print(pPVar1,
                     "public static com.google.protobuf.Parser<$classname$> parser() {\n  return PARSER;\n}\n\n@java.lang.Override\npublic com.google.protobuf.Parser<$classname$> getParserForType() {\n  return PARSER;\n}\n\n"
                     ,"classname",psVar3);
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateParser(io::Printer* printer) {
  printer->Print(
      "$visibility$ static final com.google.protobuf.Parser<$classname$>\n"
      "    PARSER = new com.google.protobuf.AbstractParser<$classname$>() {\n",
      "visibility",
      ExposePublicParser(descriptor_->file()) ? "@java.lang.Deprecated public"
                                              : "private",
      "classname", descriptor_->name());
  printer->Indent();
  printer->Print(
      "public $classname$ parsePartialFrom(\n"
      "    com.google.protobuf.CodedInputStream input,\n"
      "    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n"
      "    throws com.google.protobuf.InvalidProtocolBufferException {\n",
      "classname", descriptor_->name());
  if (context_->HasGeneratedMethods(descriptor_)) {
    printer->Print(
        "    return new $classname$(input, extensionRegistry);\n",
        "classname", descriptor_->name());
  } else {
    // When parsing constructor isn't generated, use builder to parse
    // messages. Note, will fallback to use reflection based mergeFieldFrom()
    // in AbstractMessage.Builder.
    printer->Indent();
    printer->Print(
        "Builder builder = newBuilder();\n"
        "try {\n"
        "  builder.mergeFrom(input, extensionRegistry);\n"
        "} catch (com.google.protobuf.InvalidProtocolBufferException e) {\n"
        "  throw e.setUnfinishedMessage(builder.buildPartial());\n"
        "} catch (java.io.IOException e) {\n"
        "  throw new com.google.protobuf.InvalidProtocolBufferException(\n"
        "      e.getMessage()).setUnfinishedMessage(\n"
        "          builder.buildPartial());\n"
        "}\n"
        "return builder.buildPartial();\n");
    printer->Outdent();
  }
  printer->Print(
        "}\n");
  printer->Outdent();
  printer->Print(
      "};\n"
      "\n");

  printer->Print(
      "public static com.google.protobuf.Parser<$classname$> parser() {\n"
      "  return PARSER;\n"
      "}\n"
      "\n"
      "@java.lang.Override\n"
      "public com.google.protobuf.Parser<$classname$> getParserForType() {\n"
      "  return PARSER;\n"
      "}\n"
      "\n",
      "classname", descriptor_->name());
}